

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TensorUtils.hpp
# Opt level: O1

uint64_t __thiscall scp::TensorShape::getIndex(TensorShape *this,uint64_t *indices)

{
  ulong uVar1;
  uint64_t uVar2;
  ulong uVar3;
  
  uVar1 = this->order;
  if (uVar1 != 0) {
    uVar3 = 0;
    do {
      if (this->sizes[uVar3] <= indices[uVar3]) {
        __assert_fail("indices[i] < sizes[i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Reiex[P]SciPP/include/SciPP/Core/templates/TensorUtils.hpp"
                      ,0x77,"uint64_t scp::TensorShape::getIndex(const uint64_t *) const");
      }
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  uVar2 = *indices;
  if (1 < uVar1) {
    uVar3 = 1;
    do {
      uVar2 = uVar2 * this->sizes[uVar3] + indices[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  return uVar2;
}

Assistant:

constexpr uint64_t TensorShape::getIndex(const uint64_t* indices) const
	{
		for (uint64_t i = 0; i < order; ++i)
		{
			assert(indices[i] < sizes[i]);
		}

		uint64_t result = indices[0];
		for (uint64_t i = 1; i < order; ++i)
		{
			result = result * sizes[i] + indices[i];
		}

		return result;
	}